

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_insert.cpp
# Opt level: O3

vector<unsigned_long,_true> *
duckdb::GetColumnsToFetch(vector<unsigned_long,_true> *__return_storage_ptr__,TableBinding *binding)

{
  pointer pCVar1;
  iterator __position;
  vector<duckdb::ColumnIndex,_true> *pvVar2;
  ColumnIndex *col;
  pointer pCVar3;
  unsigned_long local_28;
  
  pvVar2 = TableBinding::GetBoundColumnIds(binding);
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar1 = (pvVar2->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (pvVar2->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    local_28 = pCVar3->index;
    __position._M_current =
         (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
                 __position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<column_t> GetColumnsToFetch(const TableBinding &binding) {
	auto &bound_columns = binding.GetBoundColumnIds();
	vector<column_t> result;
	for (auto &col : bound_columns) {
		result.push_back(col.GetPrimaryIndex());
	}
	return result;
}